

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpressionResult.cpp
# Opt level: O2

void Js::JavascriptRegularExpressionResult::InstantiateForceInlinedMembers(void)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpressionResult.cpp"
                              ,0x44,"(false)","false");
  if (bVar2) {
    *puVar3 = 0;
    Create((void *)0x0,(JavascriptString *)0x0,(ScriptContext *)0x0);
    Create((void *)0x0,0,(JavascriptString *)0x0,(ScriptContext *)0x0);
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void JavascriptRegularExpressionResult::InstantiateForceInlinedMembers()
    {
        // Force-inlined functions defined in a translation unit need a reference from an extern non-force-inlined function in
        // the same translation unit to force an instantiation of the force-inlined function. Otherwise, if the force-inlined
        // function is not referenced in the same translation unit, it will not be generated and the linker is not able to find
        // the definition to inline the function in other translation units.
        Assert(false);

        Create(nullptr, nullptr, nullptr);
        Create(nullptr, 0, nullptr, nullptr);
    }